

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  ulong uVar16;
  secp256k1_fe *psVar17;
  int64_t iVar18;
  uint64_t *puVar19;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  secp256k1_modinv64_modinfo *psVar25;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  ulong *extraout_RDX_03;
  uint64_t uVar26;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  secp256k1_modinv64_signed62 *a;
  secp256k1_fe *psVar27;
  ulong uVar28;
  secp256k1_fe *psVar29;
  secp256k1_fe *psVar30;
  secp256k1_modinv64_signed62 *psVar31;
  secp256k1_fe *psVar32;
  secp256k1_fe *psVar33;
  secp256k1_modinv64_signed62 *a_00;
  long lVar34;
  uint64_t *puVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  uint64_t *puVar41;
  secp256k1_modinv64_modinfo *psVar42;
  secp256k1_fe *psVar43;
  secp256k1_fe *psVar44;
  ulong uVar45;
  bool bVar46;
  secp256k1_modinv64_signed62 f;
  uint64_t c1;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 sStack_330;
  secp256k1_modinv64_signed62 sStack_308;
  secp256k1_fe *psStack_2e0;
  secp256k1_fe *psStack_2d8;
  secp256k1_fe *psStack_2d0;
  ulong uStack_2c8;
  secp256k1_fe *psStack_2c0;
  ulong uStack_2b8;
  secp256k1_fe *psStack_2b0;
  secp256k1_fe *psStack_2a8;
  secp256k1_fe *psStack_2a0;
  uint64_t uStack_298;
  uint64_t uStack_290;
  secp256k1_fe *psStack_288;
  secp256k1_fe *psStack_280;
  uint64_t uStack_278;
  uint64_t uStack_270;
  secp256k1_fe *psStack_268;
  secp256k1_fe *psStack_260;
  uint64_t uStack_258;
  secp256k1_fe *psStack_250;
  ulong uStack_248;
  secp256k1_modinv64_modinfo *psStack_240;
  ulong uStack_238;
  secp256k1_fe *psStack_230;
  code *pcStack_228;
  code *pcStack_220;
  secp256k1_fe *local_210;
  ulong local_208;
  secp256k1_fe *local_200;
  ulong local_1f8;
  secp256k1_fe *local_1f0;
  ulong local_1e8;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long local_1b8;
  long local_1b0;
  secp256k1_fe local_1a8;
  long local_178;
  secp256k1_fe *local_170;
  ulong local_168;
  ulong local_160;
  secp256k1_fe *local_158;
  ulong local_150;
  ulong local_148;
  secp256k1_fe *local_140;
  secp256k1_fe local_138;
  secp256k1_fe local_108;
  secp256k1_modinv64_trans2x2 local_d8;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  secp256k1_fe local_68;
  
  local_1d8 = 0;
  pcStack_220 = (code *)0x11b37d;
  local_158 = r;
  secp256k1_fe_verify(x);
  local_178 = 0x1000003d1;
  uVar20 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar28 = (uVar20 >> 0x34) + x->n[1];
  uVar22 = (uVar28 >> 0x34) + x->n[2];
  uVar23 = (uVar22 >> 0x34) + x->n[3];
  uVar24 = (uVar23 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_160 = (uVar28 | uVar20 | uVar22 | uVar23) & 0xfffffffffffff | uVar24;
  local_168 = (uVar20 ^ 0x1000003d0) & uVar28 & uVar22 & uVar23 & (uVar24 ^ 0xf000000000000);
  pcStack_220 = (code *)0x11b400;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  pcStack_220 = (code *)0x11b432;
  local_170 = x;
  secp256k1_fe_normalize(&local_68);
  local_138.n[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_208 = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_1f8 = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_1d0 = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_138.n[4] = local_68.n[4] >> 0x28;
  local_b8._16_8_ = 0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  local_b8._32_8_ = (secp256k1_fe *)0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8._40_4_ = 1;
  local_b8._44_4_ = 0;
  local_1a8.n[2] = 0;
  local_1a8.n[3] = 0;
  local_1a8.n[0] = -0x1000003d1;
  local_1a8.n[1] = 0;
  local_1a8.n[4] = 0x100;
  psVar32 = &local_108;
  uVar23 = 0x100;
  local_1c8 = 0;
  local_1e8 = 0;
  uVar24 = 0xffffffffffffffff;
  iVar14 = 0;
  uVar20 = local_138.n[0];
  uVar22 = 0x1000003d0;
  psVar44 = (secp256k1_fe *)0xfffffffefffffc2f;
  local_1f0 = (secp256k1_fe *)local_138.n[4];
  local_138.n[1] = local_208;
  local_138.n[2] = local_1f8;
  local_138.n[3] = local_1d0;
  local_108.n[0] = local_138.n[0];
  local_108.n[1] = local_208;
  local_108.n[2] = local_1f8;
  local_108.n[3] = local_1d0;
  local_108.n[4] = local_138.n[4];
  do {
    uVar28 = 8;
    lVar21 = 3;
    psVar42 = (secp256k1_modinv64_modinfo *)0x0;
    psVar27 = (secp256k1_fe *)0x0;
    psVar29 = (secp256k1_fe *)0x8;
    local_210 = (secp256k1_fe *)0x8;
    uVar16 = uVar20;
    psVar17 = psVar44;
    psVar33 = psVar32;
    do {
      local_150 = uVar23;
      if (((ulong)psVar17 & 1) == 0) {
        pcStack_220 = (code *)0x11be8c;
        secp256k1_fe_inv_cold_22();
        psVar32 = psVar33;
LAB_0011be8c:
        pcStack_220 = (code *)0x11be91;
        secp256k1_fe_inv_cold_1();
LAB_0011be91:
        pcStack_220 = (code *)0x11be96;
        secp256k1_fe_inv_cold_2();
LAB_0011be96:
        pcStack_220 = (code *)0x11be9b;
        secp256k1_fe_inv_cold_21();
        goto LAB_0011be9b;
      }
      psVar32 = (secp256k1_fe *)((long)psVar42 * uVar20 + uVar28 * (long)psVar44);
      psVar29 = (secp256k1_fe *)((long)psVar17 << ((byte)lVar21 & 0x3f));
      if (psVar32 != psVar29) goto LAB_0011be8c;
      psVar32 = (secp256k1_fe *)((long)local_210 * uVar20 + (long)psVar27 * (long)psVar44);
      psVar29 = (secp256k1_fe *)(uVar16 << ((byte)lVar21 & 0x3f));
      if (psVar32 != psVar29) goto LAB_0011be91;
      psVar29 = (secp256k1_fe *)((long)uVar24 >> 0x3f);
      local_148 = (ulong)((uint)uVar16 & 1);
      uVar37 = -local_148;
      psVar33 = (secp256k1_fe *)((ulong)psVar29 & uVar37);
      uVar24 = uVar24 ^ (ulong)psVar33;
      psVar32 = psVar33;
      uVar22 = uVar20;
      local_140 = psVar29;
      if (uVar24 - 0x251 < 0xfffffffffffffb61) goto LAB_0011be96;
      uVar24 = uVar24 - 1;
      psVar32 = (secp256k1_fe *)
                ((long)local_210->n + (((ulong)psVar29 ^ (ulong)psVar42) - (long)psVar29 & uVar37));
      psVar42 = (secp256k1_modinv64_modinfo *)
                (((long)(psVar42->modulus).v + ((ulong)psVar32 & (ulong)psVar33)) * 2);
      psVar27 = (secp256k1_fe *)
                ((long)psVar27->n + (((ulong)psVar29 ^ uVar28) - (long)psVar29 & uVar37));
      uVar28 = (uVar28 + ((ulong)psVar27 & (ulong)psVar33)) * 2;
      uVar37 = (((ulong)psVar29 ^ (ulong)psVar17) - (long)psVar29 & uVar37) + uVar16;
      uVar16 = uVar37 >> 1;
      psVar17 = (secp256k1_fe *)((long)psVar17->n + (uVar37 & (ulong)psVar33));
      lVar21 = lVar21 + 1;
      local_210 = psVar32;
    } while (lVar21 != 0x3e);
    psVar29 = (secp256k1_fe *)((long)psVar42 * (long)psVar27);
    psVar25 = SUB168(SEXT816((long)psVar42) * SEXT816((long)psVar27),8);
    psVar17 = psVar44;
    local_200 = psVar44;
    local_1dc = iVar14;
    local_d8.u = uVar28;
    local_d8.v = (int64_t)psVar42;
    local_d8.q = (int64_t)psVar27;
    local_d8.r = (int64_t)psVar32;
    if ((SUB168(SEXT816((long)uVar28) * SEXT816((long)psVar32),8) - (long)psVar25) -
        (ulong)((secp256k1_fe *)(uVar28 * (long)psVar32) < psVar29) != 2 ||
        (long)(uVar28 * (long)psVar32) - (long)psVar29 != 0) goto LAB_0011bef0;
    pcStack_220 = (code *)0x11b71e;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)local_b8,
               (secp256k1_modinv64_signed62 *)(local_b8 + 0x28),&local_d8,psVar25);
    psVar44 = &local_1a8;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11b73e;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) {
LAB_0011be9b:
      pcStack_220 = (code *)0x11bea0;
      secp256k1_fe_inv_cold_20();
LAB_0011bea0:
      pcStack_220 = (code *)0x11bea5;
      secp256k1_fe_inv_cold_19();
LAB_0011bea5:
      pcStack_220 = (code *)0x11beaa;
      secp256k1_fe_inv_cold_18();
LAB_0011beaa:
      pcStack_220 = (code *)0x11beaf;
      secp256k1_fe_inv_cold_17();
LAB_0011beaf:
      pcStack_220 = (code *)0x11beb4;
      secp256k1_fe_inv_cold_4();
      uVar23 = uVar22;
LAB_0011beb4:
      pcStack_220 = (code *)0x11beb9;
      secp256k1_fe_inv_cold_5();
LAB_0011beb9:
      pcStack_220 = (code *)0x11bebe;
      secp256k1_fe_inv_cold_16();
LAB_0011bebe:
      pcStack_220 = (code *)0x11bec3;
      secp256k1_fe_inv_cold_15();
LAB_0011bec3:
      pcStack_220 = (code *)0x11bec8;
      secp256k1_fe_inv_cold_14();
LAB_0011bec8:
      pcStack_220 = (code *)0x11becd;
      secp256k1_fe_inv_cold_13();
LAB_0011becd:
      pcStack_220 = (code *)0x11bed2;
      secp256k1_fe_inv_cold_12();
LAB_0011bed2:
      pcStack_220 = (code *)0x11bed7;
      secp256k1_fe_inv_cold_11();
LAB_0011bed7:
      pcStack_220 = (code *)0x11bedc;
      secp256k1_fe_inv_cold_10();
LAB_0011bedc:
      psVar17 = psVar44;
      pcStack_220 = (code *)0x11bee1;
      secp256k1_fe_inv_cold_9();
      goto LAB_0011bee1;
    }
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11b75f;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (0 < iVar14) goto LAB_0011bea0;
    psVar44 = &local_108;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11b78a;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_0011bea5;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11b7ab;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_0011beaa;
    uVar16 = uVar28 * (long)local_200 + (long)psVar42 * uVar20;
    lVar34 = SUB168(SEXT816((long)uVar28) * SEXT816((long)local_200),8) +
             SUB168(SEXT816((long)psVar42) * SEXT816((long)uVar20),8) +
             (ulong)CARRY8(uVar28 * (long)local_200,(long)psVar42 * uVar20);
    psVar29 = SUB168(SEXT816((long)local_210) * SEXT816((long)uVar20),8);
    psVar32 = (secp256k1_fe *)((long)psVar27 * (long)local_200 + (long)local_210 * uVar20);
    lVar21 = (long)psVar29->n +
             (ulong)CARRY8((long)psVar27 * (long)local_200,(long)local_210 * uVar20) +
             SUB168(SEXT816((long)psVar27) * SEXT816((long)local_200),8);
    if ((uVar16 & 0x3ffffffffffffffe) != 0) goto LAB_0011beaf;
    uVar23 = uVar20;
    if (((ulong)psVar32 & 0x3fffffffffffffff) != 0) goto LAB_0011beb4;
    local_1b8 = (long)uVar28 >> 0x3f;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar28;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1e8;
    uVar20 = SUB168(auVar1 * auVar8,0);
    local_1b0 = (long)psVar27 >> 0x3f;
    uVar23 = uVar16 >> 0x3e | lVar34 * 4;
    uVar22 = (ulong)psVar32 >> 0x3e | lVar21 * 4;
    uVar16 = (long)psVar42 * local_208 + uVar20;
    uVar37 = uVar16 + uVar23;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)local_208),8) +
             local_1b8 * local_1e8 + SUB168(auVar1 * auVar8,8) +
             (ulong)CARRY8((long)psVar42 * local_208,uVar20) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar16,uVar23);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = psVar27;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1e8;
    uVar20 = SUB168(auVar2 * auVar9,0);
    uVar23 = (long)local_210 * local_208 + uVar20;
    local_1c0 = uVar23 + uVar22;
    lVar21 = SUB168(SEXT816((long)local_210) * SEXT816((long)local_208),8) +
             local_1e8 * local_1b0 + SUB168(auVar2 * auVar9,8) +
             (ulong)CARRY8((long)local_210 * local_208,uVar20) + (lVar21 >> 0x3e) +
             (ulong)CARRY8(uVar23,uVar22);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar28;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_1c8;
    uVar20 = SUB168(auVar3 * auVar10,0);
    uVar16 = lVar34 * 4 | uVar37 >> 0x3e;
    local_200 = (secp256k1_fe *)(uVar37 & 0x3fffffffffffffff);
    uVar23 = lVar21 * 4 | local_1c0 >> 0x3e;
    local_1c0 = local_1c0 & 0x3fffffffffffffff;
    uVar22 = (long)psVar42 * local_1f8 + uVar20;
    local_1e8 = uVar22 + uVar16;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)local_1f8),8) +
             local_1b8 * local_1c8 + SUB168(auVar3 * auVar10,8) +
             (ulong)CARRY8((long)psVar42 * local_1f8,uVar20) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar22,uVar16);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = psVar27;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_1c8;
    uVar20 = SUB168(auVar4 * auVar11,0);
    uVar22 = (long)local_210 * local_1f8 + uVar20;
    local_208 = uVar22 + uVar23;
    lVar21 = SUB168(SEXT816((long)local_210) * SEXT816((long)local_1f8),8) +
             local_1c8 * local_1b0 + SUB168(auVar4 * auVar11,8) +
             (ulong)CARRY8((long)local_210 * local_1f8,uVar20) + (lVar21 >> 0x3e) +
             (ulong)CARRY8(uVar22,uVar23);
    uVar23 = lVar34 * 4 | local_1e8 >> 0x3e;
    local_1e8 = local_1e8 & 0x3fffffffffffffff;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar28;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_1d8;
    uVar20 = SUB168(auVar5 * auVar12,0);
    uVar22 = lVar21 * 4 | local_208 >> 0x3e;
    local_208 = local_208 & 0x3fffffffffffffff;
    uVar16 = (long)psVar42 * local_1d0 + uVar20;
    local_1c8 = uVar16 + uVar23;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)local_1d0),8) +
             local_1b8 * local_1d8 + SUB168(auVar5 * auVar12,8) +
             (ulong)CARRY8((long)psVar42 * local_1d0,uVar20) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar16,uVar23);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = psVar27;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_1d8;
    uVar20 = SUB168(auVar6 * auVar13,0);
    uVar23 = local_1b0 * local_1d8 + SUB168(auVar6 * auVar13,8);
    uVar16 = (long)local_210 * local_1d0 + uVar20;
    psVar32 = (secp256k1_fe *)(uVar16 + uVar22);
    psVar29 = (secp256k1_fe *)
              (SUB168(SEXT816((long)local_210) * SEXT816((long)local_1d0),8) + uVar23 +
               (ulong)CARRY8((long)local_210 * local_1d0,uVar20) + (lVar21 >> 0x3e) +
              (ulong)CARRY8(uVar16,uVar22));
    uVar22 = lVar34 * 4 | local_1c8 >> 0x3e;
    local_1c8 = local_1c8 & 0x3fffffffffffffff;
    local_1f8 = (ulong)psVar32 & 0x3fffffffffffffff;
    auVar1 = SEXT816((long)uVar28);
    uVar20 = uVar28 * local_150;
    uVar28 = uVar20 + uVar22;
    lVar21 = SUB168(auVar1 * SEXT816((long)local_150),8) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar20,uVar22);
    uVar20 = (long)psVar42 * (long)local_1f0;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)local_1f0),8);
    if (lVar34 < 0) {
      lVar40 = (-0x8000000000000000 - lVar34) - (ulong)(uVar20 != 0);
      lVar38 = lVar21 - lVar40;
      bVar46 = SBORROW8(lVar21,lVar40) != SBORROW8(lVar38,(ulong)(uVar28 < -uVar20));
      lVar38 = lVar38 - (ulong)(uVar28 < -uVar20);
    }
    else {
      uVar22 = (ulong)(-uVar20 - 1 < uVar28);
      lVar38 = (0x7fffffffffffffff - lVar34) - lVar21;
      bVar46 = SBORROW8(0x7fffffffffffffff - lVar34,lVar21) != SBORROW8(lVar38,uVar22);
      lVar38 = lVar38 - uVar22;
    }
    psVar44 = &local_1a8;
    psVar42 = &secp256k1_const_modinfo_fe;
    local_1a8.n[0] = (uint64_t)local_200;
    local_1a8.n[1] = local_1e8;
    local_1a8.n[2] = local_1c8;
    local_108.n[0] = local_1c0;
    local_108.n[1] = local_208;
    local_108.n[2] = local_1f8;
    if (bVar46 != lVar38 < 0) goto LAB_0011beb9;
    uVar22 = (ulong)psVar32 >> 0x3e | (long)psVar29 * 4;
    bVar46 = CARRY8(uVar28,uVar20);
    uVar28 = uVar28 + uVar20;
    lVar21 = lVar21 + lVar34 + (ulong)bVar46;
    auVar1 = SEXT816((long)psVar27);
    uVar20 = (long)psVar27 * local_150;
    psVar27 = (secp256k1_fe *)(uVar20 + uVar22);
    lVar38 = SUB168(auVar1 * SEXT816((long)local_150),8) + ((long)psVar29 >> 0x3e) +
             (ulong)CARRY8(uVar20,uVar22);
    uVar20 = (long)local_210 * (long)local_1f0;
    lVar34 = SUB168(SEXT816((long)local_210) * SEXT816((long)local_1f0),8);
    if (lVar34 < 0) {
      psVar32 = (secp256k1_fe *)((-0x8000000000000000 - lVar34) - (ulong)(uVar20 != 0));
      psVar29 = (secp256k1_fe *)
                ((lVar38 - (long)psVar32) - (ulong)(psVar27 < (secp256k1_fe *)-uVar20));
      if ((SBORROW8(lVar38,(long)psVar32) !=
          SBORROW8(lVar38 - (long)psVar32,(ulong)(psVar27 < (secp256k1_fe *)-uVar20))) ==
          (long)psVar29 < 0) goto LAB_0011bb43;
      goto LAB_0011bebe;
    }
    psVar29 = (secp256k1_fe *)(-1 - uVar20);
    lVar40 = (0x7fffffffffffffff - lVar34) - lVar38;
    psVar32 = (secp256k1_fe *)(lVar40 - (ulong)(psVar29 < psVar27));
    if ((SBORROW8(0x7fffffffffffffff - lVar34,lVar38) != SBORROW8(lVar40,(ulong)(psVar29 < psVar27))
        ) != (long)psVar32 < 0) goto LAB_0011bebe;
LAB_0011bb43:
    bVar46 = CARRY8((ulong)psVar27,uVar20);
    psVar27 = (secp256k1_fe *)((long)psVar27->n + uVar20);
    lVar34 = lVar38 + lVar34 + (ulong)bVar46;
    uVar23 = lVar21 * 4 | uVar28 >> 0x3e;
    uVar28 = uVar28 & 0x3fffffffffffffff;
    local_108.n[3] = (ulong)psVar27 & 0x3fffffffffffffff;
    local_1a8.n[3] = uVar28;
    if ((lVar21 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar23) != -1) goto LAB_0011bec3;
    psVar27 = (secp256k1_fe *)((ulong)psVar27 >> 0x3e | lVar34 * 4);
    local_1a8.n[4] = uVar23;
    if ((lVar34 >> 0x3e) + -1 + (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar27) != -1)
    goto LAB_0011bec8;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11bbd3;
    psVar32 = psVar44;
    local_1d0 = local_108.n[3];
    local_108.n[4] = (uint64_t)psVar27;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_0011becd;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11bbf0;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (0 < iVar14) goto LAB_0011bed2;
    psVar44 = &local_108;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11bc17;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_0011bed7;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11bc34;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    psVar17 = local_200;
    if (-1 < iVar14) goto LAB_0011bedc;
    iVar14 = local_1dc + 1;
    uVar20 = local_1c0;
    uVar22 = uVar23;
    psVar44 = local_200;
    local_1f0 = psVar27;
    local_1d8 = uVar28;
  } while (iVar14 != 10);
  psVar32 = &local_108;
  psVar29 = (secp256k1_fe *)0x5;
  pcStack_220 = (code *)0x11bc80;
  iVar14 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar14 == 0) {
    pcStack_220 = (code *)0x11bca5;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)&local_1a8,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar25 = extraout_RDX;
    if (iVar14 == 0) {
LAB_0011bd5a:
      pcStack_220 = (code *)0x11bd6d;
      secp256k1_modinv64_normalize_62((secp256k1_modinv64_signed62 *)local_b8,uVar23,psVar25);
      psVar27 = local_158;
      local_138.n[4] = local_b8._32_8_;
      local_138.n[2] = local_b8._16_8_;
      local_138.n[3] = local_b8._24_8_;
      local_138.n[0] = local_b8._0_8_;
      local_138.n[1] = local_b8._8_8_;
      pcStack_220 = (code *)0x11bd9b;
      secp256k1_fe_from_signed62(local_158,(secp256k1_modinv64_signed62 *)&local_138);
      psVar27->magnitude = (uint)(0 < local_170->magnitude);
      psVar27->normalized = 1;
      pcStack_220 = (code *)0x11bdbe;
      secp256k1_fe_verify(psVar27);
      uVar22 = (psVar27->n[4] >> 0x30) * local_178 + psVar27->n[0];
      uVar20 = (uVar22 >> 0x34) + psVar27->n[1];
      uVar16 = (uVar20 >> 0x34) + psVar27->n[2];
      uVar37 = (uVar16 >> 0x34) + psVar27->n[3];
      psVar29 = (secp256k1_fe *)((uVar37 >> 0x34) + (psVar27->n[4] & 0xffffffffffff));
      psVar32 = (secp256k1_fe *)
                ((uVar22 ^ 0x1000003d0) & uVar20 & uVar16 & uVar37 &
                ((ulong)psVar29 ^ 0xf000000000000));
      if ((local_168 != 0xfffffffffffff && local_160 != 0) !=
          (psVar32 == (secp256k1_fe *)0xfffffffffffff ||
          ((uVar20 | uVar22 | uVar16 | uVar37) & 0xfffffffffffff) == 0 &&
          psVar29 == (secp256k1_fe *)0x0)) {
        secp256k1_fe_verify(psVar27);
        return;
      }
      goto LAB_0011bee6;
    }
    pcStack_220 = (code *)0x11bcc8;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)&local_1a8,5,&SECP256K1_SIGNED62_ONE,1);
    psVar25 = extraout_RDX_00;
    if (iVar14 == 0) goto LAB_0011bd5a;
    psVar32 = &local_138;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_220 = (code *)0x11bceb;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar14 == 0) {
      psVar32 = (secp256k1_fe *)local_b8;
      psVar29 = (secp256k1_fe *)0x5;
      pcStack_220 = (code *)0x11bd0e;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar14 == 0) {
        pcStack_220 = (code *)0x11bd31;
        iVar14 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)&local_1a8,5,
                            &secp256k1_const_modinfo_fe.modulus,1);
        psVar25 = extraout_RDX_01;
        if (iVar14 != 0) {
          psVar32 = &local_1a8;
          psVar29 = (secp256k1_fe *)0x5;
          pcStack_220 = (code *)0x11bd52;
          iVar14 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)psVar32,5,
                              &secp256k1_const_modinfo_fe.modulus,-1);
          psVar25 = extraout_RDX_02;
          if (iVar14 != 0) goto LAB_0011beeb;
        }
        goto LAB_0011bd5a;
      }
    }
  }
  else {
LAB_0011bee1:
    pcStack_220 = (code *)0x11bee6;
    secp256k1_fe_inv_cold_6();
LAB_0011bee6:
    pcStack_220 = (code *)0x11beeb;
    secp256k1_fe_inv_cold_8();
  }
LAB_0011beeb:
  pcStack_220 = (code *)0x11bef0;
  secp256k1_fe_inv_cold_7();
  uVar20 = uVar23;
LAB_0011bef0:
  pcStack_220 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_3();
  uVar22 = psVar29->n[0];
  if (uVar22 >> 0x3e == 0) {
    uVar23 = psVar29->n[1];
    if (0x3fffffffffffffff < uVar23) goto LAB_0011bfc4;
    uVar16 = psVar29->n[2];
    if (0x3fffffffffffffff < uVar16) goto LAB_0011bfc9;
    uVar37 = psVar29->n[3];
    if (0x3fffffffffffffff < uVar37) goto LAB_0011bfce;
    uVar39 = psVar29->n[4];
    if (uVar39 < 0x100) {
      psVar32->n[0] = uVar22 & 0xfffffffffffff;
      psVar32->n[1] = (uVar23 & 0x3ffffffffff) << 10 | uVar22 >> 0x34;
      psVar32->n[2] = (uVar16 & 0xffffffff) << 0x14 | uVar23 >> 0x2a;
      psVar32->n[3] = (ulong)((uint)uVar37 & 0x3fffff) << 0x1e | uVar16 >> 0x20;
      psVar32->n[4] = uVar39 << 0x28 | uVar37 >> 0x16;
      return;
    }
  }
  else {
    pcStack_228 = (code *)0x11bfc4;
    secp256k1_fe_from_signed62_cold_5();
LAB_0011bfc4:
    pcStack_228 = (code *)0x11bfc9;
    secp256k1_fe_from_signed62_cold_4();
LAB_0011bfc9:
    pcStack_228 = (code *)0x11bfce;
    secp256k1_fe_from_signed62_cold_3();
LAB_0011bfce:
    pcStack_228 = (code *)0x11bfd3;
    secp256k1_fe_from_signed62_cold_2();
  }
  pcStack_228 = secp256k1_modinv64_update_de_62;
  secp256k1_fe_from_signed62_cold_1();
  pcStack_228 = (code *)uVar28;
  psStack_230 = psVar17;
  uStack_238 = uVar20;
  psStack_240 = psVar42;
  uStack_248 = uVar24;
  psStack_250 = psVar27;
  uVar26 = psVar32->n[0];
  psStack_260 = (secp256k1_fe *)psVar32->n[1];
  uStack_270 = psVar32->n[2];
  uStack_278 = psVar32->n[3];
  uStack_298 = psVar32->n[4];
  psVar44 = (secp256k1_fe *)psVar29->n[0];
  uStack_258 = psVar29->n[1];
  psStack_280 = (secp256k1_fe *)psVar29->n[2];
  psStack_268 = (secp256k1_fe *)psVar29->n[3];
  uStack_2b8 = *extraout_RDX_03;
  psStack_2b0 = (secp256k1_fe *)extraout_RDX_03[1];
  uStack_2c8 = extraout_RDX_03[2];
  psStack_2c0 = (secp256k1_fe *)extraout_RDX_03[3];
  uStack_290 = psVar29->n[4];
  psVar30 = (secp256k1_fe *)0x5;
  uVar20 = 0xfffffffffffffffe;
  psStack_2d0 = (secp256k1_fe *)0x11c074;
  psVar33 = psVar32;
  iVar14 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar32,5,&secp256k1_const_modinfo_fe.modulus,
                      -2);
  psVar27 = psVar32;
  if (iVar14 < 1) {
LAB_0011c90e:
    psStack_2d0 = (secp256k1_fe *)0x11c913;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0011c913:
    psStack_2d0 = (secp256k1_fe *)0x11c918;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011c918:
    psStack_2d0 = (secp256k1_fe *)0x11c91d;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011c91d:
    psStack_2d0 = (secp256k1_fe *)0x11c922;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0011c922:
    psStack_2d0 = (secp256k1_fe *)0x11c927;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0011c927:
    psStack_2d0 = (secp256k1_fe *)0x11c92c;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011c92c:
    psStack_2d0 = (secp256k1_fe *)0x11c931;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0011c931:
    psStack_2d0 = (secp256k1_fe *)0x11c936;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0011c936:
    psStack_2d0 = (secp256k1_fe *)0x11c93b;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0011c93b:
    psStack_2d0 = (secp256k1_fe *)0x11c940;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0011c940:
    psStack_2d0 = (secp256k1_fe *)0x11c945;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0011c945:
    psStack_2d0 = (secp256k1_fe *)0x11c94a;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_0011c94a:
    psStack_2d0 = (secp256k1_fe *)0x11c94f;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0011c94f:
    psStack_2d0 = (secp256k1_fe *)0x11c954;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_0011c954:
    psStack_2d0 = (secp256k1_fe *)0x11c959;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0011c959:
    psStack_2d0 = (secp256k1_fe *)0x11c95e;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011c95e:
    psStack_2d0 = (secp256k1_fe *)0x11c963;
    secp256k1_modinv64_update_de_62_cold_22();
  }
  else {
    uVar20 = 1;
    psVar30 = (secp256k1_fe *)0x5;
    psStack_2d0 = (secp256k1_fe *)0x11c095;
    psVar33 = psVar32;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar32,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_0011c913;
    psVar30 = (secp256k1_fe *)0x5;
    uVar20 = 0xfffffffffffffffe;
    psStack_2d0 = (secp256k1_fe *)0x11c0b8;
    psVar33 = psVar29;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar29,5,&secp256k1_const_modinfo_fe.modulus
                        ,-2);
    if (iVar14 < 1) goto LAB_0011c918;
    uVar20 = 1;
    psVar30 = (secp256k1_fe *)0x5;
    psStack_2d0 = (secp256k1_fe *)0x11c0d9;
    psVar33 = psVar29;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar29,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_0011c91d;
    psStack_2d0 = (secp256k1_fe *)0x11c0f5;
    psVar17 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_2b8);
    psStack_2d0 = (secp256k1_fe *)0x11c102;
    psVar33 = psStack_2b0;
    iVar18 = secp256k1_modinv64_abs((int64_t)psStack_2b0);
    uVar20 = 0x4000000000000000 - iVar18;
    if ((long)uVar20 < (long)psVar17) goto LAB_0011c922;
    psStack_2d0 = (secp256k1_fe *)0x11c11d;
    psVar17 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_2c8);
    psStack_2d0 = (secp256k1_fe *)0x11c12a;
    psVar33 = psStack_2c0;
    iVar18 = secp256k1_modinv64_abs((int64_t)psStack_2c0);
    uVar20 = 0x4000000000000000 - iVar18;
    if ((long)uVar20 < (long)psVar17) goto LAB_0011c927;
    psVar30 = (secp256k1_fe *)(uStack_2b8 * uVar26);
    uVar20 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uVar26),8);
    uVar22 = (long)psStack_2b0 * (long)psVar44;
    lVar34 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psVar44),8);
    psVar27 = (secp256k1_fe *)0x7fffffffffffffff;
    psVar33 = (secp256k1_fe *)~uVar22;
    lVar21 = (0x7fffffffffffffff - lVar34) - uVar20;
    psStack_2a0 = psVar32;
    if ((SBORROW8(0x7fffffffffffffff - lVar34,uVar20) != SBORROW8(lVar21,(ulong)(psVar33 < psVar30))
        ) != (long)(lVar21 - (ulong)(psVar33 < psVar30)) < 0 && -1 < lVar34) goto LAB_0011c95e;
    puVar19 = (uint64_t *)((long)psVar30->n + uVar22);
    psVar32 = (secp256k1_fe *)(lVar34 + uVar20 + (ulong)CARRY8(uVar22,(ulong)psVar30));
    psVar17 = (secp256k1_fe *)(uStack_2c8 * uVar26);
    lVar34 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uVar26),8);
    uVar22 = (long)psStack_2c0 * (long)psVar44;
    psVar33 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psVar44),8);
    uVar20 = (ulong)((secp256k1_fe *)(-1 - uVar22) < psVar17);
    lVar21 = (0x7fffffffffffffff - (long)psVar33) - lVar34;
    bVar46 = (SBORROW8(0x7fffffffffffffff - (long)psVar33,lVar34) != SBORROW8(lVar21,uVar20)) !=
             (long)(lVar21 - uVar20) < 0;
    uVar20 = CONCAT71((int7)(-1 - uVar22 >> 8),bVar46 && -1 < (long)psVar33);
    if (!bVar46 || -1 >= (long)psVar33) {
      puVar41 = (uint64_t *)((long)uStack_298 >> 0x3f);
      uVar20 = (long)uStack_290 >> 0x3f;
      lVar21 = ((ulong)psStack_2b0 & uVar20) + (uStack_2b8 & (ulong)puVar41);
      psVar44 = (secp256k1_fe *)0xfffffffefffffc2f;
      puVar35 = (uint64_t *)((long)psVar17->n + uVar22);
      psVar33 = (secp256k1_fe *)((long)psVar33->n + (ulong)CARRY8(uVar22,(ulong)psVar17) + lVar34);
      uVar22 = 0x27c7f6e22ddacacf;
      psVar30 = (secp256k1_fe *)
                (lVar21 - ((long)puVar19 * 0x27c7f6e22ddacacf + lVar21 & 0x3fffffffffffffffU));
      psVar17 = (secp256k1_fe *)((long)psVar30 * -0x1000003d1);
      uVar26 = SUB168(SEXT816((long)psVar30) * SEXT816(-0x1000003d1),8);
      psStack_2a8 = psVar29;
      if (0 < (long)psVar30) {
        lVar34 = (-0x8000000000000000 - uVar26) - (ulong)(psVar17 != (secp256k1_fe *)0x0);
        uVar23 = (ulong)(puVar19 < (undefined1 *)((long)psVar30 * 0x1000003d1));
        lVar21 = (long)psVar32 - lVar34;
        if ((SBORROW8((long)psVar32,lVar34) != SBORROW8(lVar21,uVar23)) ==
            (long)(lVar21 - uVar23) < 0) goto LAB_0011c263;
LAB_0011c3bd:
        psStack_2d0 = (secp256k1_fe *)0x11c3c2;
        secp256k1_modinv64_update_de_62_cold_20();
LAB_0011c3c2:
        uVar23 = (ulong)((undefined1 *)(-1 - (long)puVar19) < puVar35);
        lVar21 = (0x7fffffffffffffff - (long)psVar44) - (long)psVar33;
        psVar29 = psVar32;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar44,(long)psVar33) != SBORROW8(lVar21,uVar23))
            != (long)(lVar21 - uVar23) < 0) goto LAB_0011c3de;
LAB_0011c2d2:
        bVar46 = CARRY8((ulong)puVar19,(ulong)puVar35);
        puVar19 = (uint64_t *)((long)puVar35 + (long)puVar19);
        psVar44 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar46 + (long)psVar44->n);
        if (((ulong)psVar17 & 0x3fffffffffffffff) != 0) goto LAB_0011c92c;
        if (((ulong)puVar19 & 0x3fffffffffffffff) == 0) {
          psVar17 = (secp256k1_fe *)((ulong)psVar17 >> 0x3e | uVar26 << 2);
          puVar41 = (uint64_t *)((long)psVar17->n + uStack_2b8 * (long)psStack_260);
          uVar22 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)psStack_260),8) +
                   ((long)uVar26 >> 0x3e) +
                   (ulong)CARRY8(uStack_2b8 * (long)psStack_260,(ulong)psVar17);
          uVar23 = (long)psStack_2b0 * uStack_258;
          lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_258),8);
          psVar32 = psStack_260;
          uVar26 = uStack_258;
          psStack_288 = psVar29;
          if (lVar21 < 0) goto LAB_0011c3e3;
          uVar24 = (ulong)((undefined1 *)(-1 - uVar23) < puVar41);
          lVar34 = (0x7fffffffffffffff - lVar21) - uVar22;
          if ((SBORROW8(0x7fffffffffffffff - lVar21,uVar22) != SBORROW8(lVar34,uVar24)) ==
              (long)(lVar34 - uVar24) < 0) goto LAB_0011c353;
          goto LAB_0011c405;
        }
        goto LAB_0011c931;
      }
      uVar23 = (ulong)((undefined1 *)((long)psVar30 * 0x1000003d1 + -1) < puVar19);
      lVar21 = (0x7fffffffffffffff - uVar26) - (long)psVar32;
      if ((SBORROW8(0x7fffffffffffffff - uVar26,(long)psVar32) != SBORROW8(lVar21,uVar23)) !=
          (long)(lVar21 - uVar23) < 0) goto LAB_0011c3bd;
LAB_0011c263:
      lVar21 = (uVar20 & (ulong)psStack_2c0) + ((ulong)puVar41 & uStack_2c8);
      uVar22 = (long)puVar35 * 0x27c7f6e22ddacacf + lVar21 & 0x3fffffffffffffff;
      uVar20 = lVar21 - uVar22;
      bVar46 = CARRY8((ulong)psVar17,(ulong)puVar19);
      psVar17 = (secp256k1_fe *)((long)puVar19 + (long)psVar17->n);
      uVar26 = (long)psVar32->n + bVar46 + uVar26;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar20;
      puVar19 = SUB168(auVar7 * ZEXT816(0xfffffffefffffc2f),0);
      psVar32 = (secp256k1_fe *)((long)uVar20 >> 0x3f);
      puVar41 = (uint64_t *)(SUB168(auVar7 * ZEXT816(0xfffffffefffffc2f),8) - uVar20);
      psVar44 = (secp256k1_fe *)((long)psVar32 * -0x1000003d1 + (long)puVar41);
      if ((long)uVar20 < 1) goto LAB_0011c3c2;
      lVar34 = (-0x8000000000000000 - (long)psVar44) - (ulong)(puVar19 != (uint64_t *)0x0);
      lVar21 = (long)psVar33 - lVar34;
      psVar29 = psVar32;
      if ((SBORROW8((long)psVar33,lVar34) !=
          SBORROW8(lVar21,(ulong)(puVar35 < (undefined1 *)-(long)puVar19))) ==
          (long)(lVar21 - (ulong)(puVar35 < (undefined1 *)-(long)puVar19)) < 0) goto LAB_0011c2d2;
LAB_0011c3de:
      psStack_2d0 = (secp256k1_fe *)0x11c3e3;
      secp256k1_modinv64_update_de_62_cold_19();
      uVar23 = extraout_RAX;
      lVar21 = extraout_RDX_04;
LAB_0011c3e3:
      lVar38 = (-0x8000000000000000 - lVar21) - (ulong)(uVar23 != 0);
      lVar34 = uVar22 - lVar38;
      if ((SBORROW8(uVar22,lVar38) != SBORROW8(lVar34,(ulong)(puVar41 < (undefined1 *)-uVar23))) ==
          (long)(lVar34 - (ulong)(puVar41 < (undefined1 *)-uVar23)) < 0) {
LAB_0011c353:
        uVar24 = (ulong)puVar19 >> 0x3e | (long)psVar44 << 2;
        bVar46 = CARRY8((ulong)puVar41,uVar23);
        puVar41 = (uint64_t *)((long)puVar41 + uVar23);
        uVar22 = uVar22 + lVar21 + (ulong)bVar46;
        psVar17 = (secp256k1_fe *)(uStack_2c8 * (long)psVar32 + uVar24);
        psVar32 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)psVar32),8) +
                   ((long)psVar44 >> 0x3e) + (ulong)CARRY8(uStack_2c8 * (long)psVar32,uVar24));
        uVar23 = (long)psStack_2c0 * uVar26;
        lVar21 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)uVar26),8);
        if (lVar21 < 0) goto LAB_0011c40a;
        psVar33 = (secp256k1_fe *)(-1 - uVar23);
        lVar34 = (0x7fffffffffffffff - lVar21) - (long)psVar32;
        bVar46 = SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar32) !=
                 SBORROW8(lVar34,(ulong)(psVar33 < psVar17));
        psVar29 = (secp256k1_fe *)(lVar34 - (ulong)(psVar33 < psVar17));
      }
      else {
LAB_0011c405:
        psStack_2d0 = (secp256k1_fe *)0x11c40a;
        secp256k1_modinv64_update_de_62_cold_18();
        uVar23 = extraout_RAX_00;
        lVar21 = extraout_RDX_05;
LAB_0011c40a:
        lVar38 = (-0x8000000000000000 - lVar21) - (ulong)(uVar23 != 0);
        lVar34 = (long)psVar32 - lVar38;
        bVar46 = SBORROW8((long)psVar32,lVar38) !=
                 SBORROW8(lVar34,(ulong)(psVar17 < (secp256k1_fe *)-uVar23));
        psVar33 = (secp256k1_fe *)(lVar34 - (ulong)(psVar17 < (secp256k1_fe *)-uVar23));
        psVar29 = psVar33;
      }
      psVar44 = psStack_280;
      psVar43 = psStack_2a8;
      if (bVar46 != (long)psVar29 < 0) goto LAB_0011c936;
      uVar16 = (long)psVar17->n + uVar23;
      lVar38 = (long)psVar32->n + (ulong)CARRY8((ulong)psVar17,uVar23) + lVar21;
      uVar24 = uVar22 << 2 | (ulong)puVar41 >> 0x3e;
      uVar28 = (ulong)puVar41 & 0x3fffffffffffffff;
      uVar23 = uStack_2b8 * uStack_270 + uVar24;
      lVar34 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_270),8) +
               ((long)uVar22 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_270,uVar24);
      psStack_2a0->n[0] = uVar28;
      uVar22 = (long)psStack_2b0 * (long)psStack_280;
      lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psStack_280),8);
      psStack_2a8->n[0] = uVar16 & 0x3fffffffffffffff;
      if (lVar21 < 0) {
        lVar40 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        if ((SBORROW8(lVar34,lVar40) != SBORROW8(lVar34 - lVar40,(ulong)(uVar23 < -uVar22))) !=
            (long)((lVar34 - lVar40) - (ulong)(uVar23 < -uVar22)) < 0) goto LAB_0011c6a2;
LAB_0011c4a0:
        uVar16 = uVar16 >> 0x3e | lVar38 * 4;
        bVar46 = CARRY8(uVar23,uVar22);
        uVar23 = uVar23 + uVar22;
        lVar34 = lVar34 + lVar21 + (ulong)bVar46;
        uVar28 = uStack_2c8 * uStack_270 + uVar16;
        lVar40 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uStack_270),8) + (lVar38 >> 0x3e)
                 + (ulong)CARRY8(uStack_2c8 * uStack_270,uVar16);
        uVar22 = (long)psStack_2c0 * (long)psStack_280;
        lVar21 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psStack_280),8);
        if (lVar21 < 0) goto LAB_0011c6a7;
        uVar24 = -uVar22 - 1;
        lVar36 = (0x7fffffffffffffff - lVar21) - lVar40;
        lVar38 = lVar36 - (ulong)(uVar24 < uVar28);
        if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar40) !=
            SBORROW8(lVar36,(ulong)(uVar24 < uVar28))) != lVar38 < 0) goto LAB_0011c6c9;
LAB_0011c4f1:
        bVar46 = CARRY8(uVar28,uVar22);
        uVar28 = uVar28 + uVar22;
        lVar40 = lVar40 + lVar21 + (ulong)bVar46;
        uVar22 = lVar34 << 2 | uVar23 >> 0x3e;
        uVar16 = uVar28 & 0x3fffffffffffffff;
        uVar24 = uStack_2b8 * uStack_278 + uVar22;
        lVar38 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_278),8) + (lVar34 >> 0x3e)
                 + (ulong)CARRY8(uStack_2b8 * uStack_278,uVar22);
        psStack_2a0->n[1] = uVar23 & 0x3fffffffffffffff;
        uVar22 = (long)psStack_2b0 * (long)psStack_268;
        lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psStack_268),8);
        psVar43->n[1] = uVar16;
        psVar44 = psStack_268;
        if (lVar21 < 0) goto LAB_0011c6ce;
        uVar23 = (ulong)(-uVar22 - 1 < uVar24);
        lVar34 = (0x7fffffffffffffff - lVar21) - lVar38;
        if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar38) != SBORROW8(lVar34,uVar23)) !=
            (long)(lVar34 - uVar23) < 0) goto LAB_0011c6f0;
LAB_0011c561:
        uVar23 = uVar28 >> 0x3e | lVar40 << 2;
        bVar46 = CARRY8(uVar24,uVar22);
        uVar24 = uVar24 + uVar22;
        lVar38 = lVar38 + lVar21 + (ulong)bVar46;
        psVar43 = (secp256k1_fe *)(uStack_2c8 * uStack_278 + uVar23);
        uVar16 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uStack_278),8) + (lVar40 >> 0x3e)
                 + (ulong)CARRY8(uStack_2c8 * uStack_278,uVar23);
        uVar22 = (long)psStack_2c0 * (long)psVar44;
        lVar21 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psVar44),8);
        if (lVar21 < 0) goto LAB_0011c6f5;
        psVar33 = (secp256k1_fe *)(-1 - uVar22);
        lVar34 = (0x7fffffffffffffff - lVar21) - uVar16;
        uVar23 = lVar34 - (ulong)(psVar33 < psVar43);
        if ((SBORROW8(0x7fffffffffffffff - lVar21,uVar16) !=
            SBORROW8(lVar34,(ulong)(psVar33 < psVar43))) == (long)uVar23 < 0) goto LAB_0011c5bc;
LAB_0011c71a:
        psStack_2d0 = (secp256k1_fe *)0x11c71f;
        secp256k1_modinv64_update_de_62_cold_13();
        uVar22 = extraout_RAX_04;
        lVar21 = extraout_RDX_09;
LAB_0011c71f:
        lVar38 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        uVar24 = ((long)psVar33 - lVar38) - (ulong)(uVar23 < -uVar22);
        if ((SBORROW8((long)psVar33,lVar38) !=
            SBORROW8((long)psVar33 - lVar38,(ulong)(uVar23 < -uVar22))) == (long)uVar24 < 0)
        goto LAB_0011c62e;
LAB_0011c73a:
        psStack_2d0 = (secp256k1_fe *)0x11c73f;
        secp256k1_modinv64_update_de_62_cold_12();
        uVar22 = extraout_RAX_05;
        lVar21 = extraout_RDX_10;
LAB_0011c73f:
        lVar40 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        lVar34 = lVar38 - lVar40;
        bVar46 = SBORROW8(lVar38,lVar40) != SBORROW8(lVar34,(ulong)(uVar24 < -uVar22));
        lVar34 = lVar34 - (ulong)(uVar24 < -uVar22);
      }
      else {
        uVar24 = (ulong)(-uVar22 - 1 < uVar23);
        lVar36 = (0x7fffffffffffffff - lVar21) - lVar34;
        lVar40 = lVar36 - uVar24;
        if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar34) != SBORROW8(lVar36,uVar24)) == lVar40 < 0)
        goto LAB_0011c4a0;
LAB_0011c6a2:
        psStack_2d0 = (secp256k1_fe *)0x11c6a7;
        secp256k1_modinv64_update_de_62_cold_16();
        uVar22 = extraout_RAX_01;
        lVar21 = extraout_RDX_06;
LAB_0011c6a7:
        lVar38 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        uVar24 = (lVar40 - lVar38) - (ulong)(uVar28 < -uVar22);
        if ((SBORROW8(lVar40,lVar38) != SBORROW8(lVar40 - lVar38,(ulong)(uVar28 < -uVar22))) ==
            (long)uVar24 < 0) goto LAB_0011c4f1;
LAB_0011c6c9:
        psStack_2d0 = (secp256k1_fe *)0x11c6ce;
        secp256k1_modinv64_update_de_62_cold_15();
        uVar22 = extraout_RAX_02;
        lVar21 = extraout_RDX_07;
LAB_0011c6ce:
        lVar36 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        lVar34 = lVar38 - lVar36;
        if ((SBORROW8(lVar38,lVar36) != SBORROW8(lVar34,(ulong)(uVar24 < -uVar22))) ==
            (long)(lVar34 - (ulong)(uVar24 < -uVar22)) < 0) goto LAB_0011c561;
LAB_0011c6f0:
        psStack_2d0 = (secp256k1_fe *)0x11c6f5;
        secp256k1_modinv64_update_de_62_cold_14();
        uVar22 = extraout_RAX_03;
        lVar21 = extraout_RDX_08;
LAB_0011c6f5:
        uVar23 = (-0x8000000000000000 - lVar21) - (ulong)(uVar22 != 0);
        psVar33 = (secp256k1_fe *)((uVar16 - uVar23) - (ulong)(psVar43 < (secp256k1_fe *)-uVar22));
        if ((SBORROW8(uVar16,uVar23) !=
            SBORROW8(uVar16 - uVar23,(ulong)(psVar43 < (secp256k1_fe *)-uVar22))) !=
            (long)psVar33 < 0) goto LAB_0011c71a;
LAB_0011c5bc:
        bVar46 = CARRY8((ulong)psVar43,uVar22);
        psVar43 = (secp256k1_fe *)((long)psVar43->n + uVar22);
        uVar16 = uVar16 + lVar21 + (ulong)bVar46;
        uVar22 = lVar38 << 2 | uVar24 >> 0x3e;
        uVar23 = uStack_2b8 * uStack_298 + uVar22;
        psVar33 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_298),8) +
                   (lVar38 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_298,uVar22));
        psStack_2a0->n[2] = uVar24 & 0x3fffffffffffffff;
        uVar22 = (long)psStack_2b0 * uStack_290;
        lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_290),8);
        psStack_2a8->n[2] = (ulong)psVar43 & 0x3fffffffffffffff;
        if (lVar21 < 0) goto LAB_0011c71f;
        uVar24 = -uVar22 - 1;
        lVar34 = (0x7fffffffffffffff - lVar21) - (long)psVar33;
        lVar38 = lVar34 - (ulong)(uVar24 < uVar23);
        if ((SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar33) !=
            SBORROW8(lVar34,(ulong)(uVar24 < uVar23))) != lVar38 < 0) goto LAB_0011c73a;
LAB_0011c62e:
        uVar28 = (ulong)psVar43 >> 0x3e | uVar16 << 2;
        bVar46 = CARRY8(uVar23,uVar22);
        uVar23 = uVar23 + uVar22;
        psVar33 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar46 + lVar21);
        uVar24 = uStack_2c8 * uStack_298 + uVar28;
        lVar38 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uStack_298),8) +
                 ((long)uVar16 >> 0x3e) + (ulong)CARRY8(uStack_2c8 * uStack_298,uVar28);
        uVar22 = (long)psStack_2c0 * uStack_290;
        lVar21 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)uStack_290),8);
        if (lVar21 < 0) goto LAB_0011c73f;
        uVar28 = (ulong)(-uVar22 - 1 < uVar24);
        lVar34 = (0x7fffffffffffffff - lVar21) - lVar38;
        bVar46 = SBORROW8(0x7fffffffffffffff - lVar21,lVar38) != SBORROW8(lVar34,uVar28);
        lVar34 = lVar34 - uVar28;
      }
      psVar17 = psStack_288;
      psVar44 = psStack_2a8;
      if (bVar46 != lVar34 < 0) goto LAB_0011c93b;
      uVar28 = uVar24 + uVar22;
      lVar21 = lVar38 + lVar21 + (ulong)CARRY8(uVar24,uVar22);
      uVar24 = ((long)psVar30 >> 0x3f) << 8 | (ulong)psVar30 >> 0x38;
      uVar22 = (long)psVar30 * 0x100;
      if ((long)psVar30 < 0) {
        uVar16 = (long)psVar30 * -0x100;
        psVar30 = (secp256k1_fe *)((-0x8000000000000000 - uVar24) - (ulong)(uVar22 != 0));
        uVar16 = (ulong)(uVar23 < uVar16);
        if ((SBORROW8((long)psVar33,(long)psVar30) != SBORROW8((long)psVar33 - (long)psVar30,uVar16)
            ) != (long)(((long)psVar33 - (long)psVar30) - uVar16) < 0) goto LAB_0011c8e9;
LAB_0011c7a2:
        bVar46 = CARRY8(uVar23,uVar22);
        uVar23 = uVar23 + uVar22;
        psVar33 = (secp256k1_fe *)((long)psVar33->n + bVar46 + uVar24);
        psVar17 = (secp256k1_fe *)((long)psStack_288 << 8 | uVar20 >> 0x38);
        uVar22 = uVar20 * 0x100;
        if ((long)uVar20 < 0) goto LAB_0011c8ee;
        uVar20 = uVar20 * -0x100 - 1;
        lVar34 = (0x7fffffffffffffff - (long)psVar17) - lVar21;
        psVar27 = (secp256k1_fe *)(lVar34 - (ulong)(uVar20 < uVar28));
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar17,lVar21) !=
            SBORROW8(lVar34,(ulong)(uVar20 < uVar28))) != (long)psVar27 < 0) goto LAB_0011c909;
      }
      else {
        uVar16 = (ulong)((long)psVar30 * -0x100 - 1U < uVar23);
        lVar34 = (0x7fffffffffffffff - uVar24) - (long)psVar33;
        psVar30 = (secp256k1_fe *)(lVar34 - uVar16);
        if ((SBORROW8(0x7fffffffffffffff - uVar24,(long)psVar33) != SBORROW8(lVar34,uVar16)) ==
            (long)psVar30 < 0) goto LAB_0011c7a2;
LAB_0011c8e9:
        psStack_2d0 = (secp256k1_fe *)0x11c8ee;
        secp256k1_modinv64_update_de_62_cold_10();
        uVar22 = extraout_RAX_06;
LAB_0011c8ee:
        lVar38 = (-0x8000000000000000 - (long)psVar17) - (ulong)(uVar22 != 0);
        lVar34 = lVar21 - lVar38;
        uVar20 = lVar34 - (ulong)(uVar28 < -uVar22);
        if ((SBORROW8(lVar21,lVar38) != SBORROW8(lVar34,(ulong)(uVar28 < -uVar22))) !=
            (long)uVar20 < 0) {
LAB_0011c909:
          psStack_2d0 = (secp256k1_fe *)0x11c90e;
          secp256k1_modinv64_update_de_62_cold_9();
          goto LAB_0011c90e;
        }
      }
      psVar27 = psStack_2a0;
      lVar21 = (long)psVar17->n + (ulong)CARRY8(uVar28,uVar22) + lVar21;
      uVar24 = (long)psVar33 << 2 | uVar23 >> 0x3e;
      psStack_2a0->n[3] = uVar23 & 0x3fffffffffffffff;
      psVar44->n[3] = uVar28 + uVar22 & 0x3fffffffffffffff;
      uVar20 = uVar24 + 0x8000000000000000;
      psVar33 = (secp256k1_fe *)
                (((long)psVar33 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar24));
      if (psVar33 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_0011c940;
      uVar20 = 0xffffffffffffffff;
      uVar22 = uVar28 + uVar22 >> 0x3e | lVar21 * 4;
      psStack_2a0->n[4] = uVar24;
      if ((lVar21 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar22) != -1) goto LAB_0011c945;
      psVar44->n[4] = uVar22;
      psVar30 = (secp256k1_fe *)0x5;
      uVar20 = 0xfffffffffffffffe;
      psStack_2d0 = (secp256k1_fe *)0x11c852;
      psVar33 = psStack_2a0;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psStack_2a0,5,
                          &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar14 < 1) goto LAB_0011c94a;
      uVar20 = 1;
      psVar30 = (secp256k1_fe *)0x5;
      psStack_2d0 = (secp256k1_fe *)0x11c873;
      psVar33 = psVar27;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar27,5,
                          &secp256k1_const_modinfo_fe.modulus,1);
      if (-1 < iVar14) goto LAB_0011c94f;
      psVar30 = (secp256k1_fe *)0x5;
      uVar20 = 0xfffffffffffffffe;
      psStack_2d0 = (secp256k1_fe *)0x11c896;
      psVar33 = psVar44;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,5,
                          &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar14 < 1) goto LAB_0011c954;
      uVar20 = 1;
      psVar30 = (secp256k1_fe *)0x5;
      psStack_2d0 = (secp256k1_fe *)0x11c8b7;
      psVar33 = psVar44;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,5,
                          &secp256k1_const_modinfo_fe.modulus,1);
      if (iVar14 < 0) {
        return;
      }
      goto LAB_0011c959;
    }
  }
  iVar14 = (int)psVar30;
  psStack_2d0 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_21();
  a_00 = &sStack_330;
  psStack_2e0 = psVar27;
  psStack_2d8 = psVar44;
  psStack_2d0 = psVar17;
  secp256k1_modinv64_mul_62(&sStack_308,(secp256k1_modinv64_signed62 *)psVar33,iVar14,1);
  psVar31 = a;
  secp256k1_modinv64_mul_62(&sStack_330,a,5,uVar20);
  lVar21 = 0;
  while ((ulong)sStack_308.v[lVar21] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_330.v[lVar21]) goto LAB_0011c9f8;
    lVar21 = lVar21 + 1;
    if (lVar21 == 4) {
      uVar15 = 4;
      while( true ) {
        if (sStack_308.v[uVar15] < sStack_330.v[uVar15]) {
          return;
        }
        if (sStack_330.v[uVar15] < sStack_308.v[uVar15]) break;
        bVar46 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        if (bVar46) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011c9f8:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar21 = a_00->v[0];
  uVar20 = a_00->v[1];
  uVar22 = a_00->v[2];
  uVar23 = a_00->v[3];
  lVar34 = a_00->v[4];
  lVar38 = 0;
  do {
    if (a_00->v[lVar38] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0011cc22:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011cc27;
    }
    if (0x3fffffffffffffff < a_00->v[lVar38]) goto LAB_0011cc22;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 5);
  iVar14 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar14 < 1) {
LAB_0011cc27:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011cc2c:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011cc31:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar14 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar14) goto LAB_0011cc2c;
    uVar24 = lVar34 >> 0x3f;
    uVar45 = (long)psVar31 >> 0x3f;
    uVar28 = (lVar21 + (uVar24 & 0xfffffffefffffc2f) ^ uVar45) - uVar45;
    uVar16 = ((long)uVar28 >> 0x3e) + ((uVar20 ^ uVar45) - uVar45);
    uVar37 = ((long)uVar16 >> 0x3e) + ((uVar22 ^ uVar45) - uVar45);
    uVar39 = ((long)uVar37 >> 0x3e) + ((uVar23 ^ uVar45) - uVar45);
    lVar21 = ((long)uVar39 >> 0x3e) + (((uVar24 & 0x100) + lVar34 ^ uVar45) - uVar45);
    uVar23 = lVar21 >> 0x3f;
    uVar20 = (uVar23 & 0xfffffffefffffc2f) + (uVar28 & 0x3fffffffffffffff);
    uVar22 = ((long)uVar20 >> 0x3e) + (uVar16 & 0x3fffffffffffffff);
    uVar24 = ((long)uVar22 >> 0x3e) + (uVar37 & 0x3fffffffffffffff);
    uVar28 = ((long)uVar24 >> 0x3e) + (uVar39 & 0x3fffffffffffffff);
    uVar23 = ((long)uVar28 >> 0x3e) + (uVar23 & 0x100) + lVar21;
    a_00->v[0] = uVar20 & 0x3fffffffffffffff;
    a_00->v[1] = uVar22 & 0x3fffffffffffffff;
    a_00->v[2] = uVar24 & 0x3fffffffffffffff;
    a_00->v[3] = uVar28 & 0x3fffffffffffffff;
    a_00->v[4] = uVar23;
    if (0x3fffffffffffffff < uVar23) goto LAB_0011cc31;
    iVar14 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar14) {
      iVar14 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar14 < 0) {
        return;
      }
      goto LAB_0011cc3b;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0011cc3b:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    secp256k1_fe_verify(x);
    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;
    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    secp256k1_fe_verify(r);
}